

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

xmlXPathObjectPtr
xmlXPtrNewRangeInternal(xmlNodePtr start,int startindex,xmlNodePtr end,int endindex)

{
  xmlXPathObjectPtr pxVar1;
  
  if (((start == (xmlNodePtr)0x0) || (start->type != XML_NAMESPACE_DECL)) &&
     ((end == (xmlNodePtr)0x0 || (end->type != XML_NAMESPACE_DECL)))) {
    pxVar1 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
    if (pxVar1 != (xmlXPathObjectPtr)0x0) {
      *(undefined8 *)pxVar1 = 0;
      pxVar1->nodesetval = (xmlNodeSetPtr)0x0;
      pxVar1->stringval = (xmlChar *)0x0;
      pxVar1->user = (void *)0x0;
      *(undefined8 *)&pxVar1->index = 0;
      pxVar1->user2 = (void *)0x0;
      *(undefined8 *)&pxVar1->boolval = 0;
      pxVar1->floatval = 0.0;
      *(undefined8 *)&pxVar1->index2 = 0;
      pxVar1->type = XPATH_RANGE;
      pxVar1->user = start;
      pxVar1->index = startindex;
      pxVar1->user2 = end;
      pxVar1->index2 = endindex;
      return pxVar1;
    }
    xmlXPtrErrMemory("allocating range");
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

static xmlXPathObjectPtr
xmlXPtrNewRangeInternal(xmlNodePtr start, int startindex,
                        xmlNodePtr end, int endindex) {
    xmlXPathObjectPtr ret;

    /*
     * Namespace nodes must be copied (see xmlXPathNodeSetDupNs).
     * Disallow them for now.
     */
    if ((start != NULL) && (start->type == XML_NAMESPACE_DECL))
	return(NULL);
    if ((end != NULL) && (end->type == XML_NAMESPACE_DECL))
	return(NULL);

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPtrErrMemory("allocating range");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlXPathObject));
    ret->type = XPATH_RANGE;
    ret->user = start;
    ret->index = startindex;
    ret->user2 = end;
    ret->index2 = endindex;
    return(ret);
}